

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLoadsXYZROTnode.h
# Opt level: O2

void __thiscall
chrono::fea::ChLoadXYZROTnodeForceAbsolute::~ChLoadXYZROTnodeForceAbsolute
          (ChLoadXYZROTnodeForceAbsolute *this)

{
  ~ChLoadXYZROTnodeForceAbsolute(this);
  ::operator_delete(this,0xc0);
  return;
}

Assistant:

class ChApi ChLoadXYZROTnodeForceAbsolute : public ChLoadXYZROTnode {
  public:
    ChLoadXYZROTnodeForceAbsolute(std::shared_ptr<ChNodeFEAxyzrot> node,  ///< node to apply load to
                                  const ChVector<>& force  ///< force to apply, assumed in absolute coordsys,
    );

    /// "Virtual" copy constructor (covariant return type).
    virtual ChLoadXYZROTnodeForceAbsolute* Clone() const override { return new ChLoadXYZROTnodeForceAbsolute(*this); }

    /// Compute the force on the node, in absolute coordsystem,
    /// given absolute position and speed of node passed via node_frame_abs_pos_vel.
    virtual void ComputeForceTorque(const ChFrameMoving<>& node_frame_abs_pos_vel,
                                    ChVector<>& abs_force,
                                    ChVector<>& abs_torque) override;

    /// Set the applied force vector: it is assumed constant, unless a
    /// non-constant scaling time function is provided.
    /// It is expressed in absolute coordinates.
    void SetForceBase(const ChVector<>& force);

    /// Return the current force vector (scaled by the current modulation value).
    ChVector<> GetForce() const;

    /// Set modulation function.
    /// This is a function of time which (optionally) modulates the specified applied force.
    /// By default the modulation is a constant function, always returning a value of 1.
    void SetModulationFunction(std::shared_ptr<ChFunction> modulation) { m_modulation = modulation; }

  protected:
    ChVector<> m_force_base;  ///< base force value

    std::shared_ptr<ChFunction> m_modulation;  ///< modulation function of time
    double m_scale;                            ///< scaling factor (current modulation value)

    virtual bool IsStiff() override { return false; }

    virtual void Update(double time) override;
}